

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_SubDEdgePtr ON_SubDEdge::FromVertices(ON_SubDVertex *vertex0,ON_SubDVertex *vertex1)

{
  ON_SubDVertex *pOVar1;
  ushort local_22;
  unsigned_short vei;
  ON_SubDVertex *vertex1_local;
  ON_SubDVertex *vertex0_local;
  ON_SubDEdgePtr eptr;
  
  if ((((vertex0 != (ON_SubDVertex *)0x0) && (vertex1 != (ON_SubDVertex *)0x0)) &&
      (vertex0 != vertex1)) && (vertex0->m_edges != (ON_SubDEdgePtr *)0x0)) {
    for (local_22 = 0; local_22 < vertex0->m_edge_count; local_22 = local_22 + 1) {
      vertex0_local = (ON_SubDVertex *)vertex0->m_edges[local_22].m_ptr;
      pOVar1 = ON_SubDEdgePtr::RelativeVertex((ON_SubDEdgePtr *)&vertex0_local,1);
      if ((vertex1 == pOVar1) &&
         (pOVar1 = ON_SubDEdgePtr::RelativeVertex((ON_SubDEdgePtr *)&vertex0_local,0),
         vertex0 == pOVar1)) {
        return (ON_SubDEdgePtr)(ON__UINT_PTR)vertex0_local;
      }
    }
  }
  return (ON_SubDEdgePtr)0;
}

Assistant:

const ON_SubDEdgePtr ON_SubDEdge::FromVertices(
  const ON_SubDVertex* vertex0,
  const ON_SubDVertex* vertex1
)
{
  if (nullptr != vertex0 && nullptr != vertex1 && vertex0 != vertex1 && nullptr != vertex0->m_edges)
  {
    for (unsigned short vei = 0; vei < vertex0->m_edge_count; vei++)
    {
      const ON_SubDEdgePtr eptr = vertex0->m_edges[vei];
      if (vertex1 == eptr.RelativeVertex(1) && vertex0 == eptr.RelativeVertex(0))
        return eptr;
    }
  }
  return ON_SubDEdgePtr::Null;
}